

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByName(Descriptor *this,string *key)

{
  bool bVar1;
  void *in_RSI;
  FileDescriptorTables *in_RDI;
  Symbol SVar2;
  Symbol result;
  Type local_28;
  Type in_stack_ffffffffffffffdc;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_ffffffffffffffe0;
  anon_union_8_8_13f84498_for_Symbol_2 local_8;
  
  file((Descriptor *)in_RDI);
  SVar2 = FileDescriptorTables::FindNestedSymbolOfType
                    (in_RDI,in_RSI,(string *)in_stack_ffffffffffffffe0.descriptor,
                     in_stack_ffffffffffffffdc);
  local_8 = SVar2.field_1;
  local_28 = SVar2.type;
  bVar1 = Symbol::IsNull((Symbol *)&local_28);
  if ((bVar1) || (bVar1 = FieldDescriptor::is_extension(local_8.field_descriptor), bVar1)) {
    local_8.descriptor = (Descriptor *)0x0;
  }
  return (FieldDescriptor *)local_8.descriptor;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByName(
    const std::string& key) const {
  Symbol result =
      file()->tables_->FindNestedSymbolOfType(this, key, Symbol::FIELD);
  if (!result.IsNull() && !result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return nullptr;
  }
}